

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  undefined8 *puVar1;
  float fVar2;
  undefined8 uVar3;
  int iVar4;
  float fVar5;
  void *pvVar6;
  ImVec4 *pIVar7;
  ImDrawChannel *__dest;
  long lVar8;
  void *pvVar9;
  long lVar10;
  char *__function;
  long lVar11;
  ImDrawChannel *pIVar12;
  void *pvVar13;
  int iVar14;
  ulong uVar15;
  
  if ((this->_ChannelsCurrent != 0) || (this->_ChannelsCount != 1)) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x114,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar4 = (this->_Channels).Size;
  iVar14 = iVar4;
  if (iVar4 < channels_count) {
    iVar14 = (this->_Channels).Capacity;
    if (iVar14 < channels_count) {
      if (iVar14 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar14 / 2 + iVar14;
      }
      if (iVar14 <= channels_count) {
        iVar14 = channels_count;
      }
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar14 << 5);
      pIVar12 = (this->_Channels).Data;
      if (pIVar12 == (ImDrawChannel *)0x0) {
        pIVar12 = (ImDrawChannel *)0x0;
      }
      else {
        memcpy(__dest,pIVar12,(long)(this->_Channels).Size << 5);
        pIVar12 = (this->_Channels).Data;
      }
      ImGui::MemFree(pIVar12);
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = iVar14;
    }
    (this->_Channels).Size = channels_count;
    iVar14 = channels_count;
  }
  this->_ChannelsCount = channels_count;
  if (0 < iVar14) {
    pIVar12 = (this->_Channels).Data;
    (pIVar12->IdxBuffer).Size = 0;
    (pIVar12->IdxBuffer).Capacity = 0;
    (pIVar12->IdxBuffer).Data = (unsigned_short *)0x0;
    (pIVar12->CmdBuffer).Size = 0;
    (pIVar12->CmdBuffer).Capacity = 0;
    (pIVar12->CmdBuffer).Data = (ImDrawCmd *)0x0;
    if (1 < channels_count) {
      uVar15 = 1;
      lVar11 = 0x38;
      do {
        lVar8 = (long)(this->_Channels).Size;
        if ((long)uVar15 < (long)iVar4) {
          if (lVar8 <= (long)uVar15) goto LAB_0013d624;
          pIVar12 = (this->_Channels).Data;
          if (*(int *)((long)pIVar12 + lVar11 + -0x14) < 0) {
            pvVar9 = ImGui::MemAlloc(0);
            pvVar6 = *(void **)((long)pIVar12 + lVar11 + -0x10);
            pvVar13 = (void *)0x0;
            if (pvVar6 != (void *)0x0) {
              memcpy(pvVar9,pvVar6,(long)*(int *)((long)pIVar12 + lVar11 + -0x18) * 0x30);
              pvVar13 = *(void **)((long)pIVar12 + lVar11 + -0x10);
            }
            ImGui::MemFree(pvVar13);
            *(void **)((long)pIVar12 + lVar11 + -0x10) = pvVar9;
            *(undefined4 *)((long)pIVar12 + lVar11 + -0x14) = 0;
            lVar8 = (long)(this->_Channels).Size;
          }
          *(undefined4 *)((long)pIVar12 + lVar11 + -0x18) = 0;
          if (lVar8 <= (long)uVar15) goto LAB_0013d624;
          pIVar12 = (this->_Channels).Data;
          if (*(int *)((long)pIVar12 + lVar11 + -4) < 0) {
            pvVar9 = ImGui::MemAlloc(0);
            pvVar6 = *(void **)((long)&(pIVar12->CmdBuffer).Size + lVar11);
            pvVar13 = (void *)0x0;
            if (pvVar6 != (void *)0x0) {
              memcpy(pvVar9,pvVar6,(long)*(int *)((long)pIVar12 + lVar11 + -8) * 2);
              pvVar13 = *(void **)((long)&(pIVar12->CmdBuffer).Size + lVar11);
            }
            ImGui::MemFree(pvVar13);
            *(void **)((long)&(pIVar12->CmdBuffer).Size + lVar11) = pvVar9;
            *(undefined4 *)((long)pIVar12 + lVar11 + -4) = 0;
          }
          *(undefined4 *)((long)pIVar12 + lVar11 + -8) = 0;
        }
        else {
          if (lVar8 <= (long)uVar15) goto LAB_0013d624;
          pIVar12 = (this->_Channels).Data;
          puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + -8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar12 + lVar11 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        if ((long)(this->_Channels).Size <= (long)uVar15) goto LAB_0013d624;
        pIVar12 = (this->_Channels).Data;
        if (*(int *)((long)pIVar12 + lVar11 + -0x18) == 0) {
          lVar8 = (long)(this->_ClipRectStack).Size;
          if (lVar8 < 1) {
            __function = "value_type &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0013d66f:
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                          ,0x365,__function);
          }
          lVar10 = (long)(this->_TextureIdStack).Size;
          if (lVar10 < 1) {
            __function = "value_type &ImVector<void *>::back() [T = void *]";
            goto LAB_0013d66f;
          }
          pIVar7 = (this->_ClipRectStack).Data;
          fVar5 = pIVar7[lVar8 + -1].x;
          uVar3 = *(undefined8 *)&pIVar7[lVar8 + -1].y;
          fVar2 = pIVar7[lVar8 + -1].w;
          pvVar6 = (this->_TextureIdStack).Data[lVar10 + -1];
          if (*(int *)((long)pIVar12 + lVar11 + -0x14) == 0) {
            pvVar13 = ImGui::MemAlloc(0x180);
            pvVar9 = *(void **)((long)pIVar12 + lVar11 + -0x10);
            if (pvVar9 == (void *)0x0) {
              pvVar9 = (void *)0x0;
            }
            else {
              memcpy(pvVar13,pvVar9,(long)*(int *)((long)pIVar12 + lVar11 + -0x18) * 0x30);
              pvVar9 = *(void **)((long)pIVar12 + lVar11 + -0x10);
            }
            ImGui::MemFree(pvVar9);
            *(void **)((long)pIVar12 + lVar11 + -0x10) = pvVar13;
            *(undefined4 *)((long)pIVar12 + lVar11 + -0x14) = 8;
            iVar14 = *(int *)((long)pIVar12 + lVar11 + -0x18);
          }
          else {
            pvVar13 = *(void **)((long)pIVar12 + lVar11 + -0x10);
            iVar14 = 0;
          }
          *(int *)((long)pIVar12 + lVar11 + -0x18) = iVar14 + 1;
          lVar8 = (long)iVar14 * 0x30;
          *(undefined4 *)((long)pvVar13 + lVar8) = 0;
          *(float *)((long)pvVar13 + lVar8 + 4) = fVar5;
          *(undefined8 *)((long)pvVar13 + lVar8 + 8) = uVar3;
          *(float *)((long)pvVar13 + lVar8 + 0x10) = fVar2;
          *(void **)((long)pvVar13 + lVar8 + 0x18) = pvVar6;
          puVar1 = (undefined8 *)((long)pvVar13 + lVar8 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        uVar15 = uVar15 + 1;
        lVar11 = lVar11 + 0x20;
      } while ((uint)channels_count != uVar15);
    }
    return;
  }
LAB_0013d624:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x35b,"value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}